

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O1

bool __thiscall LEFReader::parseOrigin(LEFReader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  _Alloc_hider _Var3;
  token_t tVar4;
  int *piVar5;
  undefined8 uVar6;
  bool bVar7;
  _Alloc_hider __nptr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  string xnum;
  string ynum;
  string local_98;
  string local_78;
  double local_58;
  string local_50;
  
  paVar8 = &local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)paVar8;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  tVar4 = tokenize(this,&local_78);
  this->m_curtok = tVar4;
  __nptr._M_p = (pointer)paVar8;
  if (tVar4 == TOK_NUMBER) {
    tVar4 = tokenize(this,&local_50);
    this->m_curtok = tVar4;
    if (tVar4 == TOK_NUMBER) {
      tVar4 = tokenize(this,&this->m_tokstr);
      __nptr._M_p = local_78._M_dataplus._M_p;
      this->m_curtok = tVar4;
      if (tVar4 == TOK_SEMICOL) {
        piVar5 = __errno_location();
        iVar2 = *piVar5;
        *piVar5 = 0;
        local_58 = strtod(__nptr._M_p,(char **)&local_98);
        _Var3._M_p = local_50._M_dataplus._M_p;
        if (local_98._M_dataplus._M_p == __nptr._M_p) {
          std::__throw_invalid_argument("stod");
          goto LAB_0012cb9c;
        }
        if (*piVar5 == 0) {
          *piVar5 = iVar2;
        }
        else if (*piVar5 == 0x22) {
          std::__throw_out_of_range("stod");
          goto LAB_0012ca48;
        }
        iVar2 = *piVar5;
        *piVar5 = 0;
        strtod(local_50._M_dataplus._M_p,(char **)&local_98);
        if (local_98._M_dataplus._M_p == _Var3._M_p) {
LAB_0012cb9c:
          uVar6 = std::__throw_invalid_argument("stod");
          if ((int *)local_98._M_dataplus._M_p != piVar5) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar1) {
            operator_delete(local_50._M_dataplus._M_p,
                            CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                     local_50.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,
                            CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                     local_78.field_2._M_local_buf[0]) + 1);
          }
          _Unwind_Resume(uVar6);
        }
        paVar8 = &local_78.field_2;
        if (*piVar5 == 0) {
LAB_0012cb76:
          *piVar5 = iVar2;
        }
        else if (*piVar5 == 0x22) {
          std::__throw_out_of_range("stod");
          goto LAB_0012cb76;
        }
        bVar7 = true;
        (*this->_vptr_LEFReader[4])(local_58,this);
        goto LAB_0012caef;
      }
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Expected a semicolon\n","");
      error(this,&local_98);
    }
    else {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Expected a number\n","");
      error(this,&local_98);
    }
  }
  else {
LAB_0012ca48:
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Expected a number\n","");
    error(this,&local_98);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)__nptr._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  bVar7 = false;
LAB_0012caef:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar8) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return bVar7;
}

Assistant:

bool LEFReader::parseOrigin()
{
    // ORIGIN <number> <number> ; 

    
    std::string xnum;
    std::string ynum;

    m_curtok = tokenize(xnum);
    if (m_curtok != TOK_NUMBER)
    {
        error("Expected a number\n");
        return false;
    }

    m_curtok = tokenize(ynum);
    if (m_curtok != TOK_NUMBER)
    {
        error("Expected a number\n");
        return false;
    }

    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_SEMICOL)
    {
        error("Expected a semicolon\n");
        return false;
    }

    double xnumd, ynumd;
    try
    {
        xnumd = std::stod(xnum);
        ynumd = std::stod(ynum);
    }
    catch(const std::invalid_argument& ia)
    {
        error(ia.what());
    }

    onOrigin(xnumd, ynumd);

    //std::cout << "  ORIGIN " << xnum << " " << ynum << "\n";

    return true;
}